

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

int select_add(event_base *base,int fd,short old,short events,void *p)

{
  __fd_mask *p_Var1;
  selectop *sop;
  int iVar2;
  int iVar3;
  int iVar4;
  int fdsz;
  
  if ((events & 8U) != 0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/select.c"
               ,0x101,"(events & EV_SIGNAL) == 0","select_add");
  }
  sop = (selectop *)base->evbase;
  if (sop->event_fds < fd) {
    iVar3 = sop->event_fdsz;
    iVar4 = 8;
    if (8 < iVar3) {
      iVar4 = iVar3;
    }
    iVar2 = (fd + 0x40) / 0x40;
    do {
      fdsz = iVar4;
      iVar4 = fdsz * 2;
    } while (SBORROW4(fdsz,iVar2 * 8) != fdsz + iVar2 * -8 < 0);
    if ((fdsz != iVar3) && (iVar3 = select_resize(sop,fdsz), iVar3 != 0)) {
      return -1;
    }
    sop->event_fds = fd;
  }
  if ((events & 2U) != 0) {
    p_Var1 = sop->event_readset_in->fds_bits + fd / 0x40;
    *p_Var1 = *p_Var1 | 1L << ((byte)fd & 0x3f);
  }
  if ((events & 4U) != 0) {
    p_Var1 = sop->event_writeset_in->fds_bits + fd / 0x40;
    *p_Var1 = *p_Var1 | 1L << ((byte)fd & 0x3f);
  }
  return 0;
}

Assistant:

static int
select_add(struct event_base *base, int fd, short old, short events, void *p)
{
	struct selectop *sop = base->evbase;
	(void) p;

	EVUTIL_ASSERT((events & EV_SIGNAL) == 0);
	check_selectop(sop);
	/*
	 * Keep track of the highest fd, so that we can calculate the size
	 * of the fd_sets for select(2)
	 */
	if (sop->event_fds < fd) {
		int fdsz = sop->event_fdsz;

		if (fdsz < (int)sizeof(fd_mask))
			fdsz = (int)sizeof(fd_mask);

		/* In theory we should worry about overflow here.  In
		 * reality, though, the highest fd on a unixy system will
		 * not overflow here. XXXX */
		while (fdsz < (int) SELECT_ALLOC_SIZE(fd + 1))
			fdsz *= 2;

		if (fdsz != sop->event_fdsz) {
			if (select_resize(sop, fdsz)) {
				check_selectop(sop);
				return (-1);
			}
		}

		sop->event_fds = fd;
	}

	if (events & EV_READ)
		FD_SET(fd, sop->event_readset_in);
	if (events & EV_WRITE)
		FD_SET(fd, sop->event_writeset_in);
	check_selectop(sop);

	return (0);
}